

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_queue.h
# Opt level: O0

bool __thiscall myutils::ShmemQueue::pop(ShmemQueue *this)

{
  bool bVar1;
  memory_order mVar2;
  int iVar3;
  int local_9c;
  duration<long,_std::ratio<1L,_1000L>_> local_98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  duration<long,_std::ratio<1L,_1000000000L>_> local_88;
  int local_7c;
  char *pcStack_78;
  int32_t pkt_size;
  char *p;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_68;
  int32_t v;
  time_point begin_time;
  bool ret;
  ShmemQueue *this_local;
  
  begin_time.__d.__r._7_1_ = 0;
  tStack_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  while( true ) {
    p._4_4_ = 0;
    mVar2 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x1dfa62) {
    default:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 2:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 3:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 4:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
    }
    if (bVar1) break;
    local_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_88.__r = (rep)std::chrono::operator-(&local_90,&stack0xffffffffffffff98);
    local_9c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_98,&local_9c);
    bVar1 = std::chrono::operator<(&local_88,&local_98);
    if (!bVar1) {
      return false;
    }
  }
  pcStack_78 = this->m_data + this->m_read_pos;
  local_7c = *(int *)pcStack_78;
  if (this->m_read_pos < this->m_write_pos) {
    this->m_read_pos = this->m_read_pos + local_7c + 4;
    if (this->m_write_pos < this->m_read_pos) {
      __assert_fail("m_read_pos <= m_write_pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                    ,0x8e,"bool myutils::ShmemQueue::pop()");
    }
    if (this->m_read_pos == this->m_write_pos) {
      this->m_write_pos = 0;
      this->m_read_pos = this->m_write_pos;
      this->m_data_size = this->m_data_realsize;
    }
  }
  else if (this->m_write_pos < this->m_read_pos) {
    this->m_read_pos = this->m_read_pos + local_7c + 4;
    if (this->m_data_size < this->m_read_pos) {
      __assert_fail("m_read_pos <= m_data_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                    ,0x96,"bool myutils::ShmemQueue::pop()");
    }
    if (this->m_read_pos == this->m_data_size) {
      this->m_read_pos = 0;
      this->m_data_size = this->m_data_realsize;
    }
  }
  std::__atomic_base<int>::operator--((__atomic_base<int> *)this,0);
  return (bool)(begin_time.__d.__r._7_1_ & 1);
}

Assistant:

bool ShmemQueue::pop()
    {
        bool ret = false;
        auto begin_time = system_clock::now();
        do {
            int32_t v = 0;
            if (m_rw_mtx.compare_exchange_strong(v, 1)) {
                char* p = m_data + m_read_pos;
                int32_t pkt_size = *(int32_t*)p;

                if (m_read_pos < m_write_pos) {
                    m_read_pos += pkt_size + 4;
                    assert(m_read_pos <= m_write_pos);
                    if (m_read_pos == m_write_pos) {
                        m_read_pos = m_write_pos = 0;
                        m_data_size = m_data_realsize; // Just ensure
                    }
                }
                else if (m_read_pos > m_write_pos) {
                    m_read_pos += pkt_size + 4;
                    assert(m_read_pos <= m_data_size);
                    if (m_read_pos == m_data_size) {
                        m_read_pos = 0;
                        m_data_size = m_data_realsize;
                    }
                }

                m_rw_mtx--;
                return ret;
            }
        } while (system_clock::now() - begin_time < milliseconds(10));

        return false;
    }